

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_relation_set.cpp
# Opt level: O1

string * __thiscall
duckdb::JoinRelationTreeNodeToString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,JoinRelationTreeNode *node)

{
  long *plVar1;
  size_type *psVar2;
  JoinRelationTreeNode *extraout_RDX;
  JoinRelationTreeNode *extraout_RDX_00;
  JoinRelationTreeNode *extraout_RDX_01;
  JoinRelationTreeNode *extraout_RDX_02;
  JoinRelationTreeNode *extraout_RDX_03;
  JoinRelationTreeNode *extraout_RDX_04;
  JoinRelationTreeNode *node_00;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_63b5960 + 9);
  node_00 = extraout_RDX;
  if (*(JoinRelationSet **)this != (JoinRelationSet *)0x0) {
    JoinRelationSet::ToString_abi_cxx11_(&local_48,*(JoinRelationSet **)this);
    plVar1 = (long *)::std::__cxx11::string::append((char *)&local_48);
    psVar2 = (size_type *)(plVar1 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar1 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar2) {
      local_68.field_2._M_allocated_capacity = *psVar2;
      local_68.field_2._8_8_ = plVar1[3];
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    }
    else {
      local_68.field_2._M_allocated_capacity = *psVar2;
      local_68._M_dataplus._M_p = (pointer)*plVar1;
    }
    local_68._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
    node_00 = extraout_RDX_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
      node_00 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
      node_00 = extraout_RDX_02;
    }
  }
  plVar1 = *(long **)(this + 0x18);
  if (plVar1 != (long *)0x0) {
    do {
      JoinRelationTreeNodeToString_abi_cxx11_(&local_68,(duckdb *)plVar1[2],node_00);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
      node_00 = extraout_RDX_03;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
        node_00 = extraout_RDX_04;
      }
      plVar1 = (long *)*plVar1;
    } while (plVar1 != (long *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

static string JoinRelationTreeNodeToString(const JoinRelationTreeNode *node) {
	string result = "";
	if (node->relation) {
		result += node->relation.get()->ToString() + "\n";
	}
	for (auto &child : node->children) {
		result += JoinRelationTreeNodeToString(child.second.get());
	}
	return result;
}